

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O1

QRect __thiscall QWidget::normalGeometry(QWidget *this)

{
  QWidgetData *pQVar1;
  QWidgetPrivate *this_00;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  QRect QVar6;
  
  pQVar1 = this->data;
  if (((pQVar1->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    uVar4 = 0xffffffffffffffff;
    uVar5 = 0;
    uVar3 = 0;
  }
  else {
    if ((pQVar1->field_0x10 & 6) == 0) {
      uVar3._0_4_ = (pQVar1->crect).x1;
      uVar3._4_4_ = (pQVar1->crect).y1;
      uVar4._0_4_ = (pQVar1->crect).x2;
      uVar4._4_4_ = (pQVar1->crect).y2;
    }
    else {
      this_00 = *(QWidgetPrivate **)&this->field_0x8;
      QWidgetPrivate::createTLExtra(this_00);
      _Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      uVar3 = *(ulong *)((long)_Var2.
                               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                               super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa0);
      uVar4 = *(undefined8 *)
               ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa8);
    }
    uVar5 = uVar3 & 0xffffffff00000000;
  }
  QVar6._0_8_ = uVar3 & 0xffffffff | uVar5;
  QVar6.x2.m_i = (int)uVar4;
  QVar6.y2.m_i = (int)((ulong)uVar4 >> 0x20);
  return QVar6;
}

Assistant:

inline Qt::WindowType QWidget::windowType() const
{ return static_cast<Qt::WindowType>((data->window_flags & Qt::WindowType_Mask).toInt()); }